

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O3

int __thiscall xray_re::ai_node::link(ai_node *this,char *__from,char *__to)

{
  uint uVar1;
  
  switch(__from) {
  case (char *)0x0:
    return *(uint *)this->data & 0x7fffff;
  case (char *)0x1:
    uVar1 = *(uint *)(this->data + 2) >> 7;
    break;
  case (char *)0x2:
    uVar1 = *(uint *)(this->data + 5) >> 6;
    break;
  case (char *)0x3:
    uVar1 = *(uint *)(this->data + 8) >> 5;
    break;
  default:
    return 0x7fffff;
  }
  return uVar1 & 0x7fffff;
}

Assistant:

uint32_t ai_node::link(uint_fast32_t side) const
{
	switch (side) {
	case 0: return as_u32(data) & AI_MAP_LINK_MASK;
	case 1: return (as_u32(data + 2) >> 7) & AI_MAP_LINK_MASK;
	case 2: return (as_u32(data + 5) >> 6) & AI_MAP_LINK_MASK;
	case 3: return (as_u32(data + 8) >> 5) & AI_MAP_LINK_MASK;
	}
	return AI_MAP_BAD_LINK;
}